

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProceduralBlockVisitor.hpp
# Opt level: O0

void __thiscall
netlist::ProceduralBlockVisitor::handle(ProceduralBlockVisitor *this,ForLoopStatement *loop)

{
  bool bVar1;
  reference ppVVar2;
  Expression *value;
  ConstantValue *pCVar3;
  iterator ppCVar4;
  reference pCVar5;
  long in_RSI;
  ValueSymbol *in_RDI;
  ConstantValue *local_res48;
  iterator __end3_2;
  iterator __begin3_2;
  SmallVector<slang::ConstantValue_*,_5UL> *__range3_2;
  size_t i;
  Expression *step;
  iterator __end3_1;
  iterator __begin3_1;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range3_1;
  ConstantValue *local;
  iterator __end3;
  iterator __begin3;
  SmallVector<slang::ConstantValue_*,_5UL> *__range3;
  ConstantValue cv_1;
  SmallVector<slang::ConstantValue,_16UL> values;
  ConstantValue cv;
  Expression *init;
  VariableSymbol *var;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL> *__range2;
  SmallVector<slang::ConstantValue_*,_5UL> localPtrs;
  anon_class_16_2_3f78c113 handleFail;
  span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL> *in_stack_fffffffffffffb78;
  EvalContext *in_stack_fffffffffffffb80;
  ConstantValue *this_00;
  undefined4 in_stack_fffffffffffffb88;
  undefined4 uVar6;
  undefined1 in_stack_fffffffffffffb8c;
  byte in_stack_fffffffffffffb8d;
  undefined1 in_stack_fffffffffffffb8e;
  undefined1 in_stack_fffffffffffffb8f;
  Statement *in_stack_fffffffffffffb90;
  anon_class_16_2_3f78c113 *in_stack_fffffffffffffba0;
  EvalContext *in_stack_fffffffffffffbc0;
  iterator local_430;
  ConstantValue *local_420;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_3e0;
  long local_3d8;
  ConstantValue *local_3d0;
  iterator local_3c8;
  iterator local_3c0;
  SmallVectorBase<slang::ConstantValue_*> *local_3b8;
  undefined1 local_3b0 [40];
  SmallVectorBase<slang::ConstantValue> local_388 [10];
  anon_class_16_2_3f78c113 local_f0 [2];
  ConstantValue *local_c8;
  uint local_98;
  Expression *local_88;
  VariableSymbol *local_80;
  VariableSymbol **local_78;
  __normal_iterator<const_slang::ast::VariableSymbol_*const_*,_std::span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL>_>
  local_70;
  long local_68;
  SmallVectorBase<slang::ConstantValue_*> local_60 [2];
  long local_20;
  long local_10;
  
  if (((((**(byte **)((long)&in_RDI[2].driverMap.field_0 + 0x40) & 1) == 0) ||
       (local_10 = in_RSI,
       bVar1 = std::span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL>::empty
                         ((span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL> *)
                          0x1db681), bVar1)) || (*(long *)(local_10 + 0x40) == 0)) ||
     ((bVar1 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::empty
                         ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                          0x1db6a5), bVar1 || (((in_RDI->super_Symbol).kind & Root) != Unknown)))) {
    slang::ast::Statement::visit<netlist::ProceduralBlockVisitor&>
              (in_stack_fffffffffffffb90,
               (ProceduralBlockVisitor *)
               CONCAT17(in_stack_fffffffffffffb8f,
                        CONCAT16(in_stack_fffffffffffffb8e,
                                 CONCAT15(in_stack_fffffffffffffb8d,
                                          CONCAT14(in_stack_fffffffffffffb8c,
                                                   in_stack_fffffffffffffb88)))));
    return;
  }
  local_20 = local_10;
  slang::SmallVector<slang::ConstantValue_*,_5UL>::SmallVector
            ((SmallVector<slang::ConstantValue_*,_5UL> *)0x1db6f8);
  local_68 = local_10 + 0x30;
  local_70._M_current =
       (VariableSymbol **)
       std::span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL>::begin
                 (in_stack_fffffffffffffb78);
  local_78 = (VariableSymbol **)
             std::span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL>::end
                       ((span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL> *)
                        CONCAT17(in_stack_fffffffffffffb8f,
                                 CONCAT16(in_stack_fffffffffffffb8e,
                                          CONCAT15(in_stack_fffffffffffffb8d,
                                                   CONCAT14(in_stack_fffffffffffffb8c,
                                                            in_stack_fffffffffffffb88)))));
  while (bVar1 = __gnu_cxx::
                 operator==<const_slang::ast::VariableSymbol_*const_*,_std::span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL>_>
                           ((__normal_iterator<const_slang::ast::VariableSymbol_*const_*,_std::span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffb80,
                            (__normal_iterator<const_slang::ast::VariableSymbol_*const_*,_std::span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffb78), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppVVar2 = __gnu_cxx::
              __normal_iterator<const_slang::ast::VariableSymbol_*const_*,_std::span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL>_>
              ::operator*(&local_70);
    local_80 = *ppVVar2;
    value = slang::ast::ValueSymbol::getInitializer((ValueSymbol *)0x1db77b);
    local_88 = value;
    if (value == (Expression *)0x0) {
      handle::anon_class_16_2_3f78c113::operator()(in_stack_fffffffffffffba0);
      local_98 = 1;
      goto LAB_001dbceb;
    }
    slang::ast::Expression::eval
              ((Expression *)
               CONCAT17(in_stack_fffffffffffffb8f,
                        CONCAT16(in_stack_fffffffffffffb8e,
                                 CONCAT15(in_stack_fffffffffffffb8d,
                                          CONCAT14(in_stack_fffffffffffffb8c,
                                                   in_stack_fffffffffffffb88)))),
               in_stack_fffffffffffffb80);
    bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x1db7ff);
    if (bVar1) {
      in_stack_fffffffffffffb90 = (Statement *)&(in_RDI->super_Symbol).name._M_str;
      in_stack_fffffffffffffba0 = local_f0;
      slang::ConstantValue::ConstantValue
                ((ConstantValue *)in_stack_fffffffffffffb80,
                 (ConstantValue *)in_stack_fffffffffffffb78);
      local_c8 = slang::ast::EvalContext::createLocal
                           (in_stack_fffffffffffffbc0,in_RDI,(ConstantValue *)value);
      slang::SmallVectorBase<slang::ConstantValue_*>::push_back
                ((SmallVectorBase<slang::ConstantValue_*> *)in_stack_fffffffffffffb80,
                 (ConstantValue **)in_stack_fffffffffffffb78);
      slang::ConstantValue::~ConstantValue((ConstantValue *)0x1db8bc);
    }
    else {
      handle::anon_class_16_2_3f78c113::operator()(in_stack_fffffffffffffba0);
    }
    local_98 = (uint)!bVar1;
    slang::ConstantValue::~ConstantValue((ConstantValue *)0x1db8d4);
    if (local_98 != 0) goto LAB_001dbceb;
    __gnu_cxx::
    __normal_iterator<const_slang::ast::VariableSymbol_*const_*,_std::span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL>_>
    ::operator++(&local_70);
  }
  slang::SmallVector<slang::ConstantValue,_16UL>::SmallVector
            ((SmallVector<slang::ConstantValue,_16UL> *)0x1db939);
  do {
    in_stack_fffffffffffffb8f =
         ProceduralBlockVisitor::step
                   ((ProceduralBlockVisitor *)
                    CONCAT17(in_stack_fffffffffffffb8f,
                             CONCAT16(in_stack_fffffffffffffb8e,
                                      CONCAT15(in_stack_fffffffffffffb8d,
                                               CONCAT14(in_stack_fffffffffffffb8c,
                                                        in_stack_fffffffffffffb88)))));
    if ((bool)in_stack_fffffffffffffb8f) {
      slang::ast::Expression::eval
                ((Expression *)
                 CONCAT17(in_stack_fffffffffffffb8f,
                          CONCAT16(in_stack_fffffffffffffb8e,
                                   CONCAT15(in_stack_fffffffffffffb8d,
                                            CONCAT14(in_stack_fffffffffffffb8c,
                                                     in_stack_fffffffffffffb88)))),
                 in_stack_fffffffffffffb80);
    }
    else {
      memset(local_3b0,0,0x28);
      slang::ConstantValue::ConstantValue((ConstantValue *)0x1db99c);
    }
    bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x1db9a9);
    if (bVar1) {
      in_stack_fffffffffffffb8e =
           slang::ConstantValue::isTrue((ConstantValue *)in_stack_fffffffffffffb80);
      if ((bool)in_stack_fffffffffffffb8e) {
        local_3b8 = local_60;
        local_3c0 = slang::SmallVectorBase<slang::ConstantValue_*>::begin(local_3b8);
        local_3c8 = slang::SmallVectorBase<slang::ConstantValue_*>::end(local_3b8);
        for (; local_3c0 != local_3c8; local_3c0 = local_3c0 + 1) {
          local_3d0 = *local_3c0;
          slang::SmallVectorBase<slang::ConstantValue>::emplace_back<slang::ConstantValue&>
                    ((SmallVectorBase<slang::ConstantValue> *)
                     CONCAT17(in_stack_fffffffffffffb8f,
                              CONCAT16(in_stack_fffffffffffffb8e,
                                       CONCAT15(in_stack_fffffffffffffb8d,
                                                CONCAT14(in_stack_fffffffffffffb8c,
                                                         in_stack_fffffffffffffb88)))),
                     (ConstantValue *)in_stack_fffffffffffffb80);
        }
        local_3d8 = local_10 + 0x48;
        local_3e0._M_current =
             (Expression **)
             std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                       ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                        in_stack_fffffffffffffb78);
        std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
                  ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                   CONCAT17(in_stack_fffffffffffffb8f,
                            CONCAT16(in_stack_fffffffffffffb8e,
                                     CONCAT15(in_stack_fffffffffffffb8d,
                                              CONCAT14(in_stack_fffffffffffffb8c,
                                                       in_stack_fffffffffffffb88)))));
        while (bVar1 = __gnu_cxx::
                       operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                                 ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                                   *)in_stack_fffffffffffffb80,
                                  (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                                   *)in_stack_fffffffffffffb78), ((bVar1 ^ 0xffU) & 1) != 0) {
          __gnu_cxx::
          __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
          ::operator*(&local_3e0);
          slang::ast::Expression::eval
                    ((Expression *)
                     CONCAT17(in_stack_fffffffffffffb8f,
                              CONCAT16(in_stack_fffffffffffffb8e,
                                       CONCAT15(in_stack_fffffffffffffb8d,
                                                CONCAT14(in_stack_fffffffffffffb8c,
                                                         in_stack_fffffffffffffb88)))),
                     in_stack_fffffffffffffb80);
          bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x1dbb63);
          in_stack_fffffffffffffb8d = bVar1 ^ 0xff;
          slang::ConstantValue::~ConstantValue((ConstantValue *)0x1dbb73);
          if ((in_stack_fffffffffffffb8d & 1) != 0) {
            handle::anon_class_16_2_3f78c113::operator()(in_stack_fffffffffffffba0);
            local_98 = 1;
            goto LAB_001dbbb8;
          }
          __gnu_cxx::
          __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
          ::operator++(&local_3e0);
        }
        local_98 = 0;
      }
      else {
        local_98 = 5;
      }
    }
    else {
      handle::anon_class_16_2_3f78c113::operator()(in_stack_fffffffffffffba0);
      local_98 = 1;
    }
LAB_001dbbb8:
    slang::ConstantValue::~ConstantValue((ConstantValue *)0x1dbbc5);
    if (local_98 != 0) break;
    in_stack_fffffffffffffb88 = 0;
  } while( true );
  if (local_98 == 5) {
    local_420 = (ConstantValue *)0x0;
    uVar6 = 5;
    do {
      this_00 = local_420;
      pCVar3 = (ConstantValue *)slang::SmallVectorBase<slang::ConstantValue>::size(local_388);
      if (pCVar3 <= this_00) {
        local_98 = 0;
        goto LAB_001dbcde;
      }
      local_430 = slang::SmallVectorBase<slang::ConstantValue_*>::begin(local_60);
      ppCVar4 = slang::SmallVectorBase<slang::ConstantValue_*>::end(local_60);
      for (; local_430 != ppCVar4; local_430 = local_430 + 1) {
        pCVar5 = slang::SmallVectorBase<slang::ConstantValue>::operator[]
                           (local_388,(size_type)local_420);
        slang::ConstantValue::operator=(this_00,pCVar5);
        local_420 = (ConstantValue *)
                    ((long)&(local_420->value).
                            super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                            .
                            super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                            .
                            super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                            .
                            super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                            .
                            super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                            .
                            super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                    + 1);
      }
      slang::ast::Statement::visit<netlist::ProceduralBlockVisitor&>
                (in_stack_fffffffffffffb90,
                 (ProceduralBlockVisitor *)
                 CONCAT17(in_stack_fffffffffffffb8f,
                          CONCAT16(in_stack_fffffffffffffb8e,
                                   CONCAT15(in_stack_fffffffffffffb8d,
                                            CONCAT14(in_stack_fffffffffffffb8c,uVar6)))));
    } while (((in_RDI->super_Symbol).kind & Root) == Unknown);
    local_98 = 1;
  }
LAB_001dbcde:
  slang::SmallVector<slang::ConstantValue,_16UL>::~SmallVector
            ((SmallVector<slang::ConstantValue,_16UL> *)0x1dbceb);
LAB_001dbceb:
  slang::SmallVector<slang::ConstantValue_*,_5UL>::~SmallVector
            ((SmallVector<slang::ConstantValue_*,_5UL> *)0x1dbcf8);
  return;
}

Assistant:

void handle(const ast::ForLoopStatement& loop) {

        // Conditions that mean this loop cannot be unrolled.
        if (!options.unrollForLoops || loop.loopVars.empty() || !loop.stopExpr ||
            loop.steps.empty() || anyErrors) {
            loop.body.visit(*this);
            return;
        }

        // Attempt to unroll the loop. If we are unable to collect constant values
        // for all loop variables across all iterations, we won't unroll at all.
        auto handleFail = [&] {
            for (auto var : loop.loopVars) {
                evalCtx.deleteLocal(var);
            }
            loop.body.visit(*this);
        };

        // Create a list of the initialised loop variables.
        SmallVector<ConstantValue*> localPtrs;
        for (auto var : loop.loopVars) {
            auto init = var->getInitializer();
            if (!init) {
                handleFail();
                return;
            }

            auto cv = init->eval(evalCtx);
            if (!cv) {
                handleFail();
                return;
            }

            localPtrs.push_back(evalCtx.createLocal(var, std::move(cv)));
        }

        // Create a list of all the loop variable values across all iterations.
        SmallVector<ConstantValue, 16> values;
        while (true) {
            auto cv = step() ? loop.stopExpr->eval(evalCtx) : ConstantValue();
            if (!cv) {
                handleFail();
                return;
            }

            if (!cv.isTrue()) {
                break;
            }

            for (auto local : localPtrs) {
                values.emplace_back(*local);
            }

            for (auto step : loop.steps) {
                if (!step->eval(evalCtx)) {
                    handleFail();
                    return;
                }
            }
        }

        // We have all the loop iteration values. Go back through
        // and visit the loop body for each iteration.
        for (size_t i = 0; i < values.size();) {
            for (auto local : localPtrs) {
                *local = std::move(values[i++]);
            }

            loop.body.visit(*this);

            if (anyErrors) {
                return;
            }
        }
    }